

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoopThread::threadFunc(EventLoopThread *this)

{
  bool bVar1;
  MutexLockGuard local_e0;
  MutexLockGuard lock;
  MutexLockGuard lock_1;
  undefined1 local_c0 [8];
  EventLoop loop;
  EventLoopThread *this_local;
  
  loop.m_pendingFunctors.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  EventLoop::EventLoop((EventLoop *)local_c0);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_callback);
  if (bVar1) {
    std::function<void_(sznet::net::EventLoop_*)>::operator()
              (&this->m_callback,(EventLoop *)local_c0);
  }
  MutexLockGuard::MutexLockGuard(&lock,&this->m_mutex);
  this->m_loop = (EventLoop *)local_c0;
  Condition::notify(&this->m_cond);
  MutexLockGuard::~MutexLockGuard(&lock);
  EventLoop::loop((EventLoop *)local_c0);
  MutexLockGuard::MutexLockGuard(&local_e0,&this->m_mutex);
  this->m_loop = (EventLoop *)0x0;
  MutexLockGuard::~MutexLockGuard(&local_e0);
  EventLoop::~EventLoop((EventLoop *)local_c0);
  return;
}

Assistant:

void EventLoopThread::threadFunc()
{
	EventLoop loop;

	// 循环前的回调任务
	if (m_callback)
	{
		m_callback(&loop);
	}

	// 创建好了，给EventLoopThread对象通知一哈
	{
		MutexLockGuard lock(m_mutex);
		m_loop = &loop;
		m_cond.notify();
	}

	loop.loop();
	// 结束
	MutexLockGuard lock(m_mutex);
	m_loop = nullptr;
}